

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_focus.h
# Opt level: O0

TPX * __thiscall
r_exec::AutoFocusController::build_tpx<r_exec::PTPX>
          (AutoFocusController *this,_Fact *target,_Fact *pattern,BindingMap *bm,RatingMap *map,
          Fact *f_imdl,bool wr_enabled)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating>,_true>
  local_78;
  P<r_exec::_Fact> local_70;
  _Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating>,_true>
  local_68;
  _Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating>,_true>
  local_60;
  const_iterator r;
  bool wr_enabled_local;
  Fact *f_imdl_local;
  RatingMap *map_local;
  BindingMap *bm_local;
  _Fact *pattern_local;
  _Fact *target_local;
  AutoFocusController *this_local;
  
  if (((this->_gtpx_on & 1U) == 0) && ((this->_ptpx_on & 1U) == 0)) {
    this_local = (AutoFocusController *)operator_new(0x50);
    TPX::TPX((TPX *)this_local,this,target,pattern,bm);
  }
  else if (wr_enabled) {
    this_local = (AutoFocusController *)operator_new(0x50);
    TPX::TPX((TPX *)this_local,this,target,pattern,bm);
  }
  else {
    core::P<r_exec::_Fact>::P(&local_70,pattern);
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating,_r_code::PHash<r_exec::_Fact>,_std::equal_to<core::P<r_exec::_Fact>_>,_std::allocator<std::pair<const_core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating>_>_>
         ::find(map,&local_70);
    std::__detail::
    _Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating>,_false,_true>
    ::_Node_const_iterator
              ((_Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating>,_false,_true>
                *)&local_60,
               (_Node_iterator<std::pair<const_core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating>,_false,_true>
                *)&local_68);
    core::P<r_exec::_Fact>::~P(&local_70);
    local_78._M_cur =
         (__node_type *)
         std::
         unordered_map<core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating,_r_code::PHash<r_exec::_Fact>,_std::equal_to<core::P<r_exec::_Fact>_>,_std::allocator<std::pair<const_core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating>_>_>
         ::end(map);
    bVar1 = std::__detail::operator!=(&local_60,&local_78);
    if (bVar1) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_r_exec::AutoFocusController::Rating>,_false,_true>
                             *)&local_60);
      bVar1 = Rating::DSR(*(double *)&pvVar2->field_0x20);
      if (bVar1) {
        this_local = (AutoFocusController *)operator_new(0x50);
        TPX::TPX((TPX *)this_local,this,target,pattern,bm);
      }
      else {
        this_local = (AutoFocusController *)operator_new(0xe0);
        PTPX::PTPX((PTPX *)this_local,this,target,pattern,bm,f_imdl);
      }
    }
    else {
      this_local = (AutoFocusController *)operator_new(0xe0);
      PTPX::PTPX((PTPX *)this_local,this,target,pattern,bm,f_imdl);
    }
  }
  return (TPX *)this_local;
}

Assistant:

TPX *build_tpx(_Fact *target, _Fact *pattern, BindingMap *bm, RatingMap &map, Fact *f_imdl, bool wr_enabled)
    {
        if (!_gtpx_on && !_ptpx_on) {
            return new TPX(this, target, pattern, bm);
        }

        if (wr_enabled) {
            return new TPX(this, target, pattern, bm);
        }

        RatingMap::const_iterator r = map.find(pattern);

        if (r != map.end()) {
            if (Rating::DSR(r->second.dSR)) { // target for which we don't see much improvement over time.
                return new TPX(this, target, pattern, bm);
            } else {
                return new T(this, target, pattern, bm, f_imdl);
            }
        } else {
            return new T(this, target, pattern, bm, f_imdl);
        }
    }